

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O2

void processContentSpecNode(ContentSpecNode *cSpecNode,bool margin)

{
  uint uVar1;
  
  if (cSpecNode != (ContentSpecNode *)0x0) {
    if (margin) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    std::operator<<((ostream *)&std::cout,"ContentType:\t");
    uVar1 = *(int *)(cSpecNode + 0x30) + 1;
    if ((uVar1 < 0x2a) && ((0x3a003e00fffU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      std::operator<<((ostream *)&std::cout,
                      &DAT_0010788c + *(int *)(&DAT_0010788c + (ulong)uVar1 * 4));
    }
    std::operator<<((ostream *)&std::cout,"\n");
    return;
  }
  return;
}

Assistant:

void processContentSpecNode( const ContentSpecNode* cSpecNode, bool margin )
{
    if( !cSpecNode )
    {
        return;
    }

    if( margin )
    {
        std::cout << "\t";
    }

    std::cout << "ContentType:\t";
    switch( cSpecNode->getType() )
    {
        case ContentSpecNode::Leaf:                std::cout << "Leaf";           break;
        case ContentSpecNode::ZeroOrOne:           std::cout << "ZeroOrOne";      break;
        case ContentSpecNode::ZeroOrMore:          std::cout << "ZeroOrMore";     break;
        case ContentSpecNode::OneOrMore:           std::cout << "OneOrMore";      break;
        case ContentSpecNode::ModelGroupChoice:    
        case ContentSpecNode::Choice:              std::cout << "Choice";         break;
        case ContentSpecNode::ModelGroupSequence:  
        case ContentSpecNode::Sequence:            std::cout << "Sequence";       break;
        case ContentSpecNode::All:                 std::cout << "All";            break;
        case ContentSpecNode::Loop:                std::cout << "Loop";           break;
        case ContentSpecNode::Any:                 std::cout << "Any";            break;
        case ContentSpecNode::Any_Other:           std::cout << "Any_Other";      break;
        case ContentSpecNode::Any_NS:              std::cout << "Any_NS";         break;
        case ContentSpecNode::Any_Lax:             std::cout << "Any_Lax";        break;
        case ContentSpecNode::Any_Other_Lax:       std::cout << "Any_Other_Lax";  break;
        case ContentSpecNode::Any_NS_Lax:          std::cout << "Any_NS_Lax";     break;
        case ContentSpecNode::Any_Skip:            std::cout << "Any_Skip";       break;
        case ContentSpecNode::Any_Other_Skip:      std::cout << "Any_Other_Skip"; break;
        case ContentSpecNode::Any_NS_Skip:         std::cout << "Any_NS_Skip";    break;
        case ContentSpecNode::Any_NS_Choice:       std::cout << "Any_NS_Choice";  break;
        case ContentSpecNode::UnknownType:         std::cout << "UnknownType";    break;
    }
    std::cout << "\n";
}